

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(char lhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  undefined8 in_RAX;
  undefined1 in_SIL;
  undefined1 in_DIL;
  undefined5 unaff_retaddr;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  undefined8 uVar3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  
  uVar3 = CONCAT26(CONCAT11((uchar)((ulong)in_RAX >> 0x38),in_SIL),CONCAT15(in_DIL,(int5)in_RAX));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xffffffffffffffff);
  SVar4.m_int = (uchar)((ulong)uVar3 >> 0x30);
  this = (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
         CONCAT35((int3)((ulong)uVar3 >> 0x28),CONCAT14(SVar4.m_int,(int)uVar3));
  bVar1 = ModulusSimpleCaseHelper<unsigned_char,_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase((char)((ulong)uVar3 >> 0x28),SVar4,
                              (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                               *)&stack0xffffffffffffffff);
  if (!bVar1) {
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xfffffffffffffffa,&stack0xfffffffffffffffd);
    SafeInt::operator_cast_to_unsigned_char
              ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(result.m_int,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))));
    SVar2 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%(this,'\0')
    ;
    this = (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           CONCAT44((int)((ulong)this >> 0x20),CONCAT13(SVar2.m_int,(int3)this));
    SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(result.m_int,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))),this);
  }
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         (uchar)((ulong)this >> 0x38);
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}